

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O0

bool __thiscall wasm::ABI::wasm2js::isHelper(wasm2js *this,IString name)

{
  bool bVar1;
  bool local_19;
  undefined1 local_18 [8];
  IString name_local;
  
  name_local.str._M_len = name.str._M_len;
  local_18 = (undefined1  [8])this;
  bVar1 = IString::operator==((IString *)local_18,(IString *)&SCRATCH_LOAD_I32);
  local_19 = true;
  if (!bVar1) {
    bVar1 = IString::operator==((IString *)local_18,(IString *)&SCRATCH_STORE_I32);
    local_19 = true;
    if (!bVar1) {
      bVar1 = IString::operator==((IString *)local_18,(IString *)&SCRATCH_LOAD_F32);
      local_19 = true;
      if (!bVar1) {
        bVar1 = IString::operator==((IString *)local_18,(IString *)&SCRATCH_STORE_F32);
        local_19 = true;
        if (!bVar1) {
          bVar1 = IString::operator==((IString *)local_18,(IString *)&SCRATCH_LOAD_F64);
          local_19 = true;
          if (!bVar1) {
            bVar1 = IString::operator==((IString *)local_18,(IString *)&SCRATCH_STORE_F64);
            local_19 = true;
            if (!bVar1) {
              bVar1 = IString::operator==((IString *)local_18,(IString *)&ATOMIC_WAIT_I32);
              local_19 = true;
              if (!bVar1) {
                bVar1 = IString::operator==((IString *)local_18,(IString *)&MEMORY_INIT);
                local_19 = true;
                if (!bVar1) {
                  bVar1 = IString::operator==((IString *)local_18,(IString *)&MEMORY_FILL);
                  local_19 = true;
                  if (!bVar1) {
                    bVar1 = IString::operator==((IString *)local_18,(IString *)&MEMORY_COPY);
                    local_19 = true;
                    if (!bVar1) {
                      bVar1 = IString::operator==((IString *)local_18,(IString *)&DATA_DROP);
                      local_19 = true;
                      if (!bVar1) {
                        bVar1 = IString::operator==((IString *)local_18,(IString *)&ATOMIC_RMW_I64);
                        local_19 = true;
                        if (!bVar1) {
                          bVar1 = IString::operator==((IString *)local_18,
                                                      (IString *)&GET_STASHED_BITS);
                          local_19 = true;
                          if (!bVar1) {
                            local_19 = IString::operator==((IString *)local_18,(IString *)&TRAP);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

inline bool isHelper(IString name) {
  return name == SCRATCH_LOAD_I32 || name == SCRATCH_STORE_I32 ||
         name == SCRATCH_LOAD_F32 || name == SCRATCH_STORE_F32 ||
         name == SCRATCH_LOAD_F64 || name == SCRATCH_STORE_F64 ||
         name == ATOMIC_WAIT_I32 || name == MEMORY_INIT ||
         name == MEMORY_FILL || name == MEMORY_COPY || name == DATA_DROP ||
         name == ATOMIC_RMW_I64 || name == GET_STASHED_BITS || name == TRAP;
}